

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocl_generic_cn_generator.cpp
# Opt level: O2

bool xmrig::ocl_generic_cn_generator(OclDevice *device,OclThreads *threads)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  OclVendor OVar4;
  uint32_t threads_00;
  uint uVar5;
  uint32_t stridedIndex;
  uint32_t intensity;
  ulong uVar6;
  long lVar7;
  OclThread local_70;
  
  if (device->m_type == Raven) {
    return false;
  }
  OVar4 = device->m_vendorId;
  if (OVar4 == OCL_VENDOR_NVIDIA) {
    bVar3 = String::contains(&device->m_name,"P100");
    lVar7 = -0x20000000;
    uVar5 = 40000;
    if ((bVar3) || (bVar3 = String::contains(&device->m_name,"V100"), bVar3)) goto LAB_0016b4d4;
    OVar4 = device->m_vendorId;
  }
  if (OVar4 == OCL_VENDOR_INTEL) {
    uVar5 = device->m_computeUnits << 4;
    lVar7 = -0x8000000;
    if (uVar5 == 40000) {
      lVar7 = -0x20000000;
    }
  }
  else {
    lVar7 = -0x8000000;
    uVar5 = 2000;
  }
LAB_0016b4d4:
  uVar1 = device->m_globalMemory;
  uVar6 = device->m_maxMemoryAlloc;
  if (uVar1 < device->m_maxMemoryAlloc) {
    uVar6 = uVar1;
  }
  bVar3 = false;
  stridedIndex = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6 + lVar7;
  uVar6 = SUB168(auVar2 / ZEXT816(0x1000e0),0) & 0xffffffff;
  if (uVar5 < SUB164(auVar2 / ZEXT816(0x1000e0),0)) {
    uVar6 = (ulong)uVar5;
  }
  intensity = (int)uVar6 - (int)(uVar6 % (ulong)(device->m_computeUnits * 8));
  if (intensity != 0) {
    if (device->m_vendorId == OCL_VENDOR_AMD) {
      if (((device->m_type | Polaris) == Lexa) || (device->m_computeUnits < 0x11)) {
        intensity = intensity >> 1;
      }
      stridedIndex = 2;
      threads_00 = 2 - (uVar1 + (ulong)(intensity * 2) * -0x100000 < 0x8000001);
    }
    else {
      threads_00 = 1;
    }
    OclThread::OclThread(&local_70,device->m_index,intensity,8,stridedIndex,2,threads_00,8);
    std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::push_back
              (&threads->m_data,&local_70);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&local_70.m_threads.super__Vector_base<long,_std::allocator<long>_>);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static uint32_t getIntensity(const OclDevice &device)
{
    if (device.type() == OclDevice::Raven) {
        return 0;
    }

    const uint32_t maxIntensity = getPossibleIntensity(device);

    uint32_t intensity = (maxIntensity / (8 * device.computeUnits())) * device.computeUnits() * 8;
    if (intensity == 0) {
        return 0;
    }

    if (device.vendorId() == OCL_VENDOR_AMD && (device.type() == OclDevice::Lexa || device.type() == OclDevice::Baffin || device.computeUnits() <= 16)) {
        intensity /= 2;
    }

    return intensity;
}